

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void bsp_end(void)

{
  Rdma *pRVar1;
  Bsmp *pBVar2;
  bool bVar3;
  int iVar4;
  int in_ESI;
  
  if (s_spmd == (Spmd *)0x0) {
    bsp_abort("bsp_end: called without calling bsp_begin() before\n");
  }
  bVar3 = bsplib::Spmd::closed(s_spmd);
  if (bVar3) {
    bsp_abort("bsp_end: may not be called multiple times\n");
  }
  iVar4 = bsplib::Spmd::end_sync(s_spmd);
  if (iVar4 != 0) {
    bsp_abort(
             "bsp_sync/bsp_end: Some processes have called bsp_sync, while others have called bsp_end instead\n"
             );
  }
  pRVar1 = s_rdma;
  if (s_rdma != (Rdma *)0x0) {
    bsplib::Rdma::~Rdma(s_rdma);
    in_ESI = 0x500;
    operator_delete(pRVar1,0x500);
  }
  pBVar2 = s_bsmp;
  s_rdma = (Rdma *)0x0;
  if (s_bsmp != (Bsmp *)0x0) {
    bsplib::Bsmp::~Bsmp(s_bsmp);
    in_ESI = 0x218;
    operator_delete(pBVar2,0x218);
  }
  s_bsmp = (Bsmp *)0x0;
  bsplib::Spmd::close(s_spmd,in_ESI);
  bVar3 = bsplib::Spmd::closed(s_spmd);
  if (bVar3) {
    return;
  }
  __assert_fail("s_spmd->closed()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsp.cc"
                ,0xff,"void bsp_end()");
}

Assistant:

void bsp_end() 
{
    if (!s_spmd)
        bsp_abort("bsp_end: called without calling bsp_begin() before\n");

    if (s_spmd->closed())
        bsp_abort("bsp_end: may not be called multiple times\n");

    if (s_spmd->end_sync())
        bsp_abort("bsp_sync/bsp_end: Some processes have called bsp_sync, "
               "while others have called bsp_end instead\n");

    
    delete s_rdma;
    s_rdma = NULL;
    delete s_bsmp;
    s_bsmp = NULL;

#ifdef PROFILE
    std::ostringstream out;
    bsplib::TicToc::print_stats( s_spmd->comm(), out );
    if ( s_spmd->pid() == 0 )
        printf("--- PROFILE between bsp_begin() - bsp_end() ---\n%s\n",
                out.str().c_str() );
#endif

    s_spmd->close();
    assert( s_spmd->closed() );
}